

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O3

compile_errcode __thiscall ConstantDefinition::Generate(ConstantDefinition *this)

{
  bool bVar1;
  SymbolName SVar2;
  undefined4 uVar3;
  string local_50;
  
  uVar3 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar3) {
    case 0:
      uVar3 = 1;
      if (SVar2 != CONST_SYM) {
        return -1;
      }
      break;
    case 1:
      if ((SVar2 & ~SWITCH_SYM) != INT_SYM) {
        return -0x7d8;
      }
      this->m_type = SVar2;
      uVar3 = 2;
      break;
    case 2:
      if (SVar2 != IDENTIFIER_SYM) {
        return -1;
      }
      c0_compile::SymbolValue::GetValue<std::__cxx11::string>
                (&local_50,
                 &(handle_correct_queue->m_symbol_queue).
                  super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                  super__Vector_impl_data._M_start[handle_correct_queue->m_current_locate].m_value);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      bVar1 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,true);
      if (bVar1) {
        this->m_valid = false;
      }
      else {
        this->m_valid = true;
      }
      uVar3 = 3;
      break;
    case 3:
      uVar3 = 4;
      if (SVar2 != ASSIGN_SYM) {
        return -1;
      }
      break;
    case 4:
      uVar3 = 5;
      if ((SVar2 != CHARACTER_SYM) && (SVar2 != INTERGER_SYM)) {
        return -1;
      }
      break;
    case 5:
      uVar3 = 2;
      if (SVar2 != COMMA_SYM) {
        if (SVar2 != SEMICOLON_SYM) {
          return -1;
        }
        uVar3 = 6;
      }
      break;
    case 6:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode ConstantDefinition::Generate() {
    int state = 0;
    int ret = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == CONST_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (IsValidVariableType(name)) {
                    state = 2;
                    m_type = name;
                    break;
                } else {
                    return INVALID_TYPE_ERROR;
                }
            }
            case 2: {
                if (name == IDENTIFIER_SYM) {
                    state = 3;
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        m_valid = false;
                    } else {
                        m_valid = true;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == ASSIGN_SYM) {
                    state = 4;
                } else {
                    return NOT_MATCH;
                }
                break;
            }
            case 4: {
                if (name == INTERGER_SYM || name == CHARACTER_SYM) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == COMMA_SYM) {
                    state = 2;
                } else if (name == SEMICOLON_SYM) {
                    state = 6;
                } else {
                   return NOT_MATCH;
                }
                break;
            }
            case 6: return COMPILE_OK;
        }
        handle_correct_queue->NextSymbol();
    }
}